

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase * AnalyzeType(ExpressionContext *ctx,SynBase *syntax,bool onlyType,bool *failed)

{
  TypeHandle **ppTVar1;
  __jmp_buf_tag *__env;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> generics;
  bool bVar2;
  uint count;
  int iVar3;
  uint uVar4;
  TypeUnsizedArray *in_RAX;
  TypeGenericAlias *pTVar5;
  TypeBase *pTVar6;
  SynBase *pSVar7;
  TypeHandle *pTVar8;
  TypeBase *pTVar9;
  undefined4 extraout_var;
  ScopeData *pSVar10;
  ScopeData *scope;
  TypeUnsizedArray *pTVar11;
  ExprBase *pEVar12;
  TypeGenericClassProto *pTVar13;
  TypeGenericClassProto *proto;
  undefined4 extraout_var_00;
  SynIdentifier *pSVar14;
  SynIdentifier *pSVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  TypeHandle *pTVar19;
  long lVar20;
  SynBase *pSVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  bool bVar25;
  IntrusiveList<TypeHandle> arguments;
  IntrusiveList<TypeHandle> local_f8 [12];
  
  if (syntax == (SynBase *)0x0) {
LAB_001588a6:
    in_RAX = (TypeUnsizedArray *)0x0;
    pTVar11 = in_RAX;
  }
  else {
    if (syntax->typeID == 5) {
      return ctx->typeAuto;
    }
    if (syntax == (SynBase *)0x0) goto LAB_001588a6;
    if (syntax->typeID == 6) {
      return ctx->typeGeneric;
    }
    if ((syntax == (SynBase *)0x0) || (pTVar11 = (TypeUnsizedArray *)syntax, syntax->typeID != 8))
    goto LAB_001588a6;
  }
  if (pTVar11 != (TypeUnsizedArray *)0x0) {
    pTVar5 = ExpressionContext::GetGenericAliasType
                       (ctx,(SynIdentifier *)(pTVar11->super_TypeStruct).super_TypeBase.refType);
    return &pTVar5->super_TypeBase;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 10)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 != (SynBase *)0x0) {
    pTVar6 = AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,true,failed);
    if (pTVar6 == (TypeBase *)0x0) {
LAB_0015891a:
      bVar2 = AssertResolvableType(ctx,syntax,pTVar6,true);
      if (bVar2) {
        in_RAX = (TypeUnsizedArray *)ExpressionContext::GetReferenceType(ctx,pTVar6);
      }
      else {
LAB_0015893e:
        in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
      }
    }
    else {
      if (pTVar6->typeID != 0xe) {
        if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0)) goto LAB_0015891a;
        goto LAB_0015893e;
      }
      in_RAX = (TypeUnsizedArray *)ctx->typeAutoRef;
    }
  }
  if (pSVar7 != (SynBase *)0x0) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 9)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 != (SynBase *)0x0) {
    pTVar6 = AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,onlyType,failed);
    if (pTVar6 == (TypeBase *)0x0 && !onlyType) {
      in_RAX = (TypeUnsizedArray *)0x0;
    }
    else if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0)) {
      in_RAX = (TypeUnsizedArray *)ApplyArraySizesToType(ctx,pTVar6,*(SynBase **)&pSVar7[1].typeID);
    }
    else {
      in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    }
  }
  if (pSVar7 != (SynBase *)0x0) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 0x19)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 != (SynBase *)0x0) {
    pTVar6 = AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,onlyType,failed);
    if (pTVar6 == (TypeBase *)0x0 && !onlyType) {
      in_RAX = (TypeUnsizedArray *)0x0;
    }
    else {
      if (pTVar6 == (TypeBase *)0x0) {
LAB_00158a7a:
        lVar16 = *(long *)&pSVar7[1].typeID;
        if (lVar16 == 0) {
          if (0xffff < pTVar6->size) {
LAB_00159597:
            pcVar18 = "ERROR: array element size cannot exceed 65535 bytes";
            goto LAB_0015972b;
          }
          bVar2 = AssertResolvableType(ctx,syntax,pTVar6,true);
          if (bVar2) {
            in_RAX = ExpressionContext::GetUnsizedArrayType(ctx,pTVar6);
            goto LAB_00158c92;
          }
        }
        else {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + 1;
            lVar16 = *(long *)(lVar16 + 0x30);
          } while (lVar16 != 0);
          if (1 < uVar4) {
            pcVar18 = "ERROR: \',\' is not expected in array type size";
            goto LAB_0015972b;
          }
          if (*(long *)(*(long *)&pSVar7[1].typeID + 0x40) != 0) {
            pcVar18 = "ERROR: named argument not expected in array type size";
            goto LAB_0015972b;
          }
          pEVar12 = AnalyzeExpression(ctx,*(SynBase **)(*(long *)&pSVar7[1].typeID + 0x48));
          if ((pEVar12->type == (TypeBase *)0x0) || (pEVar12->type->typeID != 0)) {
            pEVar12 = CreateCast(ctx,pSVar7,pEVar12,ctx->typeLong,false);
            pEVar12 = anon_unknown.dwarf_9fd58::EvaluateExpression(ctx,syntax,pEVar12);
            if ((pEVar12 == (ExprBase *)0x0) || (pEVar12->typeID != 6)) {
              pEVar12 = (ExprBase *)0x0;
            }
            if (pEVar12 == (ExprBase *)0x0) {
              in_RAX = (TypeUnsizedArray *)0x0;
            }
            else {
              if ((pTVar6 == (TypeBase *)0x0) || (pTVar9 = pTVar6, pTVar6->typeID != 0x1b)) {
                pTVar9 = (TypeBase *)0x0;
              }
              if (pTVar9 != (TypeBase *)0x0) {
                if ((long)pEVar12[1]._vptr_ExprBase < 0) {
                  pcVar18 = "ERROR: argument index can\'t be negative";
                  goto LAB_0015972b;
                }
                if (pTVar9[1]._vptr_TypeBase == (_func_int **)0x0) {
                  pcVar18 = "ERROR: function argument set is empty";
                  goto LAB_0015972b;
                }
                pTVar8 = (TypeHandle *)pTVar9[1]._vptr_TypeBase;
                uVar17 = 0;
                pTVar19 = pTVar8;
                if (pTVar8 != (TypeHandle *)0x0) {
                  do {
                    uVar4 = (int)uVar17 + 1;
                    ppTVar1 = &pTVar19->next;
                    uVar17 = (ulong)uVar4;
                    pTVar19 = *ppTVar1;
                  } while (*ppTVar1 != (TypeHandle *)0x0);
                  uVar17 = (ulong)uVar4;
                }
                if ((long)uVar17 <= (long)pEVar12[1]._vptr_ExprBase) {
                  uVar17 = 0;
                  pcVar18 = (pTVar6->name).begin;
                  if (pTVar8 != (TypeHandle *)0x0) {
                    uVar4 = 0;
                    do {
                      uVar4 = uVar4 + 1;
                      pTVar8 = pTVar8->next;
                      uVar17 = (ulong)uVar4;
                    } while (pTVar8 != (TypeHandle *)0x0);
                  }
                  anon_unknown.dwarf_9fd58::Stop
                            (ctx,syntax,"ERROR: this function type \'%.*s\' has only %d argument(s)"
                             ,(ulong)(uint)((int)(pTVar6->name).end - (int)pcVar18),pcVar18,uVar17);
                }
                pTVar8 = IntrusiveList<TypeHandle>::operator[]
                                   ((IntrusiveList<TypeHandle> *)(pTVar9 + 1),
                                    *(uint *)&pEVar12[1]._vptr_ExprBase);
                in_RAX = (TypeUnsizedArray *)pTVar8->type;
              }
              if (pTVar9 == (TypeBase *)0x0) {
                if ((long)pEVar12[1]._vptr_ExprBase < 1) {
                  pcVar18 = "ERROR: array size can\'t be negative or zero";
                  goto LAB_0015972b;
                }
                if ((pTVar6 == (TypeBase *)0x0) || (pTVar9 = pTVar6, pTVar6->typeID != 0x18)) {
                  pTVar9 = (TypeBase *)0x0;
                }
                if ((pTVar9 != (TypeBase *)0x0) &&
                   (*(char *)((long)&pTVar9[3]._vptr_TypeBase + 2) == '\x01')) {
                  uVar4 = *(int *)&(pTVar6->name).end - (int)(pTVar6->name).begin;
                  pcVar18 = 
                  "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
                  ;
                  goto LAB_0015968c;
                }
                if (0xffff < pTVar6->size) goto LAB_00159597;
                bVar2 = AssertResolvableType(ctx,syntax,pTVar6,true);
                if (bVar2) {
                  in_RAX = (TypeUnsizedArray *)
                           ExpressionContext::GetArrayType
                                     (ctx,pTVar6,(longlong)pEVar12[1]._vptr_ExprBase);
                }
                else {
                  in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
                }
              }
            }
            if (pEVar12 == (ExprBase *)0x0 && onlyType) {
              pcVar18 = "ERROR: index must be a constant expression";
              goto LAB_0015972b;
            }
            goto LAB_00158c92;
          }
        }
      }
      else {
        if (pTVar6->typeID != 1) {
          if (pTVar6 != (TypeBase *)0x0) {
            if (pTVar6->typeID == 0xe) {
              if (*(long *)&pSVar7[1].typeID != 0) {
                pcVar18 = "ERROR: cannot specify array size for auto";
                goto LAB_0015972b;
              }
              in_RAX = (TypeUnsizedArray *)ctx->typeAutoArray;
              goto LAB_00158c92;
            }
            if ((pTVar6 != (TypeBase *)0x0) && (pTVar6->typeID == 0)) goto LAB_00158c5f;
          }
          goto LAB_00158a7a;
        }
        anon_unknown.dwarf_9fd58::Report(ctx,syntax,"ERROR: cannot define an array of \'void\'");
      }
LAB_00158c5f:
      in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    }
  }
LAB_00158c92:
  if (pSVar7 != (SynBase *)0x0) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 0xb)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 != (SynBase *)0x0) {
    pTVar6 = AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,onlyType,failed);
    if (pTVar6 == (TypeBase *)0x0 && !onlyType) {
      in_RAX = (TypeUnsizedArray *)0x0;
    }
    else if (((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0)) &&
            (bVar2 = AssertResolvableType(ctx,syntax,pTVar6,true), bVar2)) {
      if (pTVar6 == ctx->typeAuto) {
        pcVar18 = "ERROR: return type of a function type cannot be auto";
        goto LAB_0015972b;
      }
      local_f8[0].head = (TypeHandle *)0x0;
      local_f8[0].tail = (TypeHandle *)0x0;
      for (pSVar21 = *(SynBase **)&pSVar7[1].typeID; pSVar21 != (SynBase *)0x0;
          pSVar21 = pSVar21->next) {
        pTVar9 = AnalyzeType(ctx,pSVar21,onlyType,failed);
        if (pTVar9 == (TypeBase *)0x0 && !onlyType) {
          in_RAX = (TypeUnsizedArray *)0x0;
          bVar2 = false;
        }
        else if (((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0)) &&
                (bVar2 = AssertResolvableType(ctx,syntax,pTVar9,true), bVar2)) {
          if (pTVar9 == ctx->typeAuto) {
            pcVar18 = "ERROR: function argument cannot be an auto type";
            goto LAB_0015972b;
          }
          if (pTVar9 == ctx->typeVoid) {
            pcVar18 = "ERROR: function argument cannot be a void type";
            goto LAB_0015972b;
          }
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pTVar8 = (TypeHandle *)CONCAT44(extraout_var,iVar3);
          pTVar8->type = pTVar9;
          pTVar8->next = (TypeHandle *)0x0;
          pTVar8->listed = false;
          IntrusiveList<TypeHandle>::push_back(local_f8,pTVar8);
          bVar2 = true;
        }
        else {
          in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
          bVar2 = false;
        }
        if (!bVar2) break;
      }
      if (pSVar21 == (SynBase *)0x0) {
        arguments_00.tail = local_f8[0].tail;
        arguments_00.head = local_f8[0].head;
        in_RAX = (TypeUnsizedArray *)
                 ExpressionContext::GetFunctionType(ctx,syntax,pTVar6,arguments_00);
      }
    }
    else {
      in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    }
  }
  if (pSVar7 != (SynBase *)0x0) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 0xd)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 == (SynBase *)0x0) {
    bVar2 = true;
  }
  else {
    __env = ctx->errorHandler;
    memcpy(local_f8,__env,200);
    bVar2 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    pcVar18 = ctx->errorBuf;
    uVar4 = ctx->errorBufSize;
    if (failed != (bool *)0x0) {
      ctx->errorBuf = (char *)0x0;
      ctx->errorBufSize = 0;
    }
    pSVar10 = ctx->scope;
    uVar22 = *(uint *)(NULLC::traceContext + 0x244);
    iVar3 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar3 == 0) {
      pTVar11 = (TypeUnsizedArray *)
                AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,false,(bool *)0x0);
      if (pTVar11 == (TypeUnsizedArray *)0x0) {
        pEVar12 = AnalyzeExpression(ctx,(SynBase *)pSVar7[1]._vptr_SynBase);
        if (pEVar12->type == ctx->typeAuto) {
          pcVar18 = "ERROR: cannot take typeid from auto type";
          goto LAB_0015972b;
        }
        AssertValueExpression(ctx,syntax,pEVar12);
        pTVar11 = (TypeUnsizedArray *)pEVar12->type;
      }
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar2;
      ctx->errorBuf = pcVar18;
      ctx->errorBufSize = uVar4;
      bVar2 = pTVar11 == (TypeUnsizedArray *)0x0;
      if (!bVar2) {
        bVar2 = false;
        bVar25 = AssertResolvableType
                           (ctx,(SynBase *)pSVar7[1]._vptr_SynBase,(TypeBase *)pTVar11,false);
        in_RAX = pTVar11;
        if (!bVar25) {
          in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
          bVar2 = false;
        }
      }
    }
    else {
      NULLC::TraceLeaveTo(uVar22);
      if (ctx->scope != pSVar10) {
        ctx->scope = pSVar10;
        ctx->lookupLocation = (SynBase *)0x0;
      }
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar2;
      ctx->errorBuf = pcVar18;
      ctx->errorBufSize = uVar4;
      if (failed == (bool *)0x0) {
        longjmp((__jmp_buf_tag *)__env,1);
      }
      *failed = true;
      bVar2 = false;
      in_RAX = (TypeUnsizedArray *)ctx->typeGeneric;
    }
  }
  if (!bVar2) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar10 = (ScopeData *)syntax, syntax->typeID != 7)) {
    pSVar10 = (ScopeData *)0x0;
  }
  if (pSVar10 != (ScopeData *)0x0) {
    scope = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(pSVar10);
    bVar2 = scope == (ScopeData *)0x0;
    if (bVar2) {
      in_RAX = (TypeUnsizedArray *)0x0;
    }
    else {
      do {
        if (scope->ownerNamespace == (NamespaceData *)0x0) {
          uVar4 = NULLC::GetStringHash("");
        }
        else {
          uVar4 = NULLC::StringHashContinue(scope->ownerNamespace->fullNameHash,".");
        }
        pTVar11 = (TypeUnsizedArray *)pSVar10->dataSize;
        while (pTVar11 != (TypeUnsizedArray *)0x0) {
          uVar4 = NULLC::StringHashContinue
                            (uVar4,(char *)(pTVar11->super_TypeStruct).super_TypeBase.refType,
                             (char *)(pTVar11->super_TypeStruct).super_TypeBase.arrayTypes.head);
          uVar4 = NULLC::StringHashContinue(uVar4,".");
          pTVar11 = (TypeUnsizedArray *)(pTVar11->super_TypeStruct).super_TypeBase.size;
          if ((pTVar11 == (TypeUnsizedArray *)0x0) ||
             ((pTVar11->super_TypeStruct).super_TypeBase.typeID != 4)) {
            pTVar11 = (TypeUnsizedArray *)0x0;
          }
        }
        uVar4 = NULLC::StringHashContinue
                          (uVar4,*(char **)&(pSVar10->types).count,
                           (char *)(pSVar10->types).little[0]);
        in_RAX = (TypeUnsizedArray *)anon_unknown.dwarf_9fd58::LookupTypeByName(ctx,uVar4);
        if (in_RAX != (TypeUnsizedArray *)0x0) break;
        scope = anon_unknown.dwarf_9fd58::NamedOrGlobalScopeFrom(scope);
        bVar2 = scope == (ScopeData *)0x0;
        in_RAX = (TypeUnsizedArray *)0x0;
      } while (!bVar2);
    }
    if ((bVar2 & onlyType) == 1) {
      anon_unknown.dwarf_9fd58::Report(ctx,syntax,"ERROR: \'%.*s\' is not a known type name");
      in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    }
  }
  if (pSVar10 != (ScopeData *)0x0) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 0x17)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 != (SynBase *)0x0) {
    pTVar6 = AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,onlyType,failed);
    if (pTVar6 == (TypeBase *)0x0 && !onlyType) {
      in_RAX = (TypeUnsizedArray *)0x0;
    }
    else if (pTVar6 == (TypeBase *)0x0) {
LAB_0015926e:
      pEVar12 = CreateTypeidMemberAccess(ctx,syntax,pTVar6,*(SynIdentifier **)&pSVar7[1].typeID);
      if ((pEVar12 == (ExprBase *)0x0) || (pEVar12->typeID != 8)) {
        pEVar12 = (ExprBase *)0x0;
      }
      if (pEVar12 == (ExprBase *)0x0) {
        in_RAX = (TypeUnsizedArray *)0x0;
      }
      else {
        in_RAX = (TypeUnsizedArray *)pEVar12[1]._vptr_ExprBase;
      }
      if (pEVar12 == (ExprBase *)0x0 && onlyType) {
        pcVar18 = "ERROR: typeof expression result is not a type";
        goto LAB_0015972b;
      }
    }
    else if (pTVar6->typeID == 0xc) {
      in_RAX = (TypeUnsizedArray *)ctx->typeGeneric;
    }
    else {
      if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0)) goto LAB_0015926e;
      in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    }
  }
  if (pSVar7 != (SynBase *)0x0) {
    return (TypeBase *)in_RAX;
  }
  if ((syntax == (SynBase *)0x0) || (pSVar7 = syntax, syntax->typeID != 0xc)) {
    pSVar7 = (SynBase *)0x0;
  }
  if (pSVar7 != (SynBase *)0x0) {
    pTVar13 = (TypeGenericClassProto *)
              AnalyzeType(ctx,(SynBase *)pSVar7[1]._vptr_SynBase,true,failed);
    if (pTVar13 == (TypeGenericClassProto *)0x0) {
LAB_00159307:
      proto = (TypeGenericClassProto *)0x0;
    }
    else {
      if ((pTVar13->super_TypeBase).typeID == 0) {
        in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
        goto LAB_00159524;
      }
      if ((pTVar13 == (TypeGenericClassProto *)0x0) ||
         (proto = pTVar13, (pTVar13->super_TypeBase).typeID != 0x16)) goto LAB_00159307;
    }
    if (proto != (TypeGenericClassProto *)0x0) {
      pSVar14 = (proto->definition->aliases).head;
      lVar16 = *(long *)&pSVar7[1].typeID;
      uVar4 = 0;
      if (lVar16 != 0) {
        uVar4 = 0;
        lVar20 = lVar16;
        do {
          uVar4 = uVar4 + 1;
          lVar20 = *(long *)(lVar20 + 0x30);
        } while (lVar20 != 0);
      }
      uVar22 = 0;
      if (pSVar14 != (SynIdentifier *)0x0) {
        uVar22 = 0;
        pSVar15 = pSVar14;
        do {
          uVar22 = uVar22 + 1;
          pSVar15 = (SynIdentifier *)(pSVar15->super_SynBase).next;
        } while (pSVar15 != (SynIdentifier *)0x0);
      }
      if (uVar4 < uVar22) {
        uVar4 = 0;
        if (lVar16 != 0) {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + 1;
            lVar16 = *(long *)(lVar16 + 0x30);
          } while (lVar16 != 0);
        }
        uVar17 = (ulong)uVar4;
        uVar23 = 0;
        if (pSVar14 != (SynIdentifier *)0x0) {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + 1;
            pSVar14 = (SynIdentifier *)(pSVar14->super_SynBase).next;
            uVar23 = (ulong)uVar4;
          } while (pSVar14 != (SynIdentifier *)0x0);
        }
        pcVar18 = "ERROR: there where only \'%d\' argument(s) to a generic type that expects \'%d\'"
        ;
LAB_00159717:
        anon_unknown.dwarf_9fd58::Stop(ctx,syntax,pcVar18,uVar17,uVar23);
      }
      lVar16 = *(long *)&pSVar7[1].typeID;
      uVar22 = 0;
      uVar4 = uVar22;
      if (lVar16 != 0) {
        uVar4 = 0;
        lVar20 = lVar16;
        do {
          uVar4 = uVar4 + 1;
          lVar20 = *(long *)(lVar20 + 0x30);
        } while (lVar20 != 0);
      }
      if (pSVar14 != (SynIdentifier *)0x0) {
        uVar22 = 0;
        pSVar15 = pSVar14;
        do {
          uVar22 = uVar22 + 1;
          pSVar15 = (SynIdentifier *)(pSVar15->super_SynBase).next;
        } while (pSVar15 != (SynIdentifier *)0x0);
      }
      if (uVar22 < uVar4) {
        uVar17 = 0;
        if (pSVar14 != (SynIdentifier *)0x0) {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + 1;
            pSVar14 = (SynIdentifier *)(pSVar14->super_SynBase).next;
            uVar17 = (ulong)uVar4;
          } while (pSVar14 != (SynIdentifier *)0x0);
        }
        uVar23 = 0;
        if (lVar16 != 0) {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + 1;
            lVar16 = *(long *)(lVar16 + 0x30);
            uVar23 = (ulong)uVar4;
          } while (lVar16 != 0);
        }
        pcVar18 = "ERROR: type has only \'%d\' generic argument(s) while \'%d\' specified";
        goto LAB_00159717;
      }
      local_f8[0].head = (TypeHandle *)0x0;
      local_f8[0].tail = (TypeHandle *)0x0;
      pSVar21 = *(SynBase **)&pSVar7[1].typeID;
      bVar2 = pSVar21 == (SynBase *)0x0;
      if (bVar2) {
        bVar24 = 0;
      }
      else {
        bVar24 = 0;
        do {
          pTVar6 = AnalyzeType(ctx,pSVar21,true,failed);
          if (pTVar6 == ctx->typeAuto) {
            pcVar18 = "ERROR: \'auto\' type cannot be used as template argument";
            goto LAB_0015972b;
          }
          if (pTVar6 == (TypeBase *)0x0) {
            bVar25 = false;
          }
          else {
            bVar25 = pTVar6->typeID == 0;
          }
          if (bVar25) {
            in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
            break;
          }
          bVar24 = bVar24 | pTVar6->isGeneric;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pTVar8 = (TypeHandle *)CONCAT44(extraout_var_00,iVar3);
          pTVar8->type = pTVar6;
          pTVar8->next = (TypeHandle *)0x0;
          pTVar8->listed = false;
          IntrusiveList<TypeHandle>::push_back(local_f8,pTVar8);
          pSVar21 = pSVar21->next;
          bVar2 = pSVar21 == (SynBase *)0x0;
        } while (!bVar2);
      }
      if (bVar2) {
        if ((bVar24 & 1) == 0) {
          in_RAX = (TypeUnsizedArray *)CreateGenericTypeInstance(ctx,syntax,proto,local_f8);
        }
        else {
          generics.tail = local_f8[0].tail;
          generics.head = local_f8[0].head;
          in_RAX = (TypeUnsizedArray *)
                   ExpressionContext::GetGenericClassType(ctx,syntax,proto,generics);
        }
      }
    }
    if (proto == (TypeGenericClassProto *)0x0) {
      uVar4 = *(int *)&(pTVar13->super_TypeBase).name.end -
              (int)(pTVar13->super_TypeBase).name.begin;
      pcVar18 = "ERROR: type \'%.*s\' can\'t have generic arguments";
LAB_0015968c:
      anon_unknown.dwarf_9fd58::Stop(ctx,syntax,pcVar18,(ulong)uVar4);
    }
  }
LAB_00159524:
  if (pSVar7 == (SynBase *)0x0) {
    if ((syntax == (SynBase *)0x0) || (syntax->typeID != 0)) {
      if (onlyType) {
        pcVar18 = "ERROR: unknown type";
LAB_0015972b:
        anon_unknown.dwarf_9fd58::Stop(ctx,syntax,pcVar18);
      }
      in_RAX = (TypeUnsizedArray *)0x0;
    }
    else {
      in_RAX = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    }
  }
  return (TypeBase *)in_RAX;
}

Assistant:

TypeBase* AnalyzeType(ExpressionContext &ctx, SynBase *syntax, bool onlyType = true, bool *failed = NULL)
{
	if(isType<SynTypeAuto>(syntax))
	{
		return ctx.typeAuto;
	}

	if(isType<SynTypeGeneric>(syntax))
	{
		return ctx.typeGeneric;
	}

	if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		return ctx.GetGenericAliasType(node->name);
	}

	if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, true, failed);

		if(isType<TypeAuto>(type))
			return ctx.typeAutoRef;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, type, true))
			return ctx.GetErrorType();

		return ctx.GetReferenceType(type);
	}

	if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		return ApplyArraySizesToType(ctx, type, node->sizes.head);
	}

	if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeVoid>(type))
		{
			Report(ctx, syntax, "ERROR: cannot define an array of 'void'");

			return ctx.GetErrorType();
		}

		if(isType<TypeAuto>(type))
		{
			if(!node->arguments.empty())
				Stop(ctx, syntax, "ERROR: cannot specify array size for auto");

			return ctx.typeAutoArray;
		}

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(node->arguments.empty())
		{
			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetUnsizedArrayType(type);
		}

		if(node->arguments.size() > 1)
			Stop(ctx, syntax, "ERROR: ',' is not expected in array type size");

		SynCallArgument *argument = node->arguments.head;

		if(argument->name)
			Stop(ctx, syntax, "ERROR: named argument not expected in array type size");

		ExprBase *size = AnalyzeExpression(ctx, argument->value);

		if(isType<TypeError>(size->type))
			return ctx.GetErrorType();

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, node, size, ctx.typeLong, false))))
		{
			if(TypeArgumentSet *lhs = getType<TypeArgumentSet>(type))
			{
				if(number->value < 0)
					Stop(ctx, syntax, "ERROR: argument index can't be negative");

				if(lhs->types.empty())
					Stop(ctx, syntax, "ERROR: function argument set is empty");

				if(number->value >= lhs->types.size())
					Stop(ctx, syntax, "ERROR: this function type '%.*s' has only %d argument(s)", FMT_ISTR(type->name), lhs->types.size());

				return lhs->types[unsigned(number->value)]->type;
			}

			if(number->value <= 0)
				Stop(ctx, syntax, "ERROR: array size can't be negative or zero");

			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->hasFinalizer)
					Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
			}

			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetArrayType(type, number->value);
		}

		if(!onlyType)
			return NULL;

		Stop(ctx, syntax, "ERROR: index must be a constant expression");
	}

	if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		TypeBase *returnType = AnalyzeType(ctx, node->returnType, onlyType, failed);

		if(!onlyType && !returnType)
			return NULL;

		if(isType<TypeError>(returnType))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, returnType, true))
			return ctx.GetErrorType();

		if(returnType == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: return type of a function type cannot be auto");

		IntrusiveList<TypeHandle> arguments;

		for(SynBase *el = node->arguments.head; el; el = el->next)
		{
			TypeBase *argType = AnalyzeType(ctx, el, onlyType, failed);

			if(!onlyType && !argType)
				return NULL;

			if(isType<TypeError>(argType))
				return ctx.GetErrorType();

			if(!AssertResolvableType(ctx, syntax, argType, true))
				return ctx.GetErrorType();

			if(argType == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(argType == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
		}

		return ctx.GetFunctionType(syntax, returnType, arguments);
	}

	if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		jmp_buf prevErrorHandler;
		memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

		bool prevErrorHandlerNested = ctx.errorHandlerNested;
		ctx.errorHandlerNested = true;

		char *errorBuf = ctx.errorBuf;
		unsigned errorBufSize = ctx.errorBufSize;

		if(failed)
		{
			ctx.errorBuf = 0;
			ctx.errorBufSize = 0;
		}

		// Remember current scope
		ScopeData *scope = ctx.scope;

		unsigned traceDepth = NULLC::TraceGetDepth();

		if(!setjmp(ctx.errorHandler))
		{
			TypeBase *type = AnalyzeType(ctx, node->value, false);

			if(!type)
			{
				ExprBase *value = AnalyzeExpression(ctx, node->value);

				if(value->type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

				AssertValueExpression(ctx, syntax, value);

				type = value->type;
			}

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(type)
			{
				if(!AssertResolvableType(ctx, node->value, type, false))
					return ctx.GetErrorType();

				return type;
			}
		}
		else
		{
			NULLC::TraceLeaveTo(traceDepth);

			// Restore original scope
			if(ctx.scope != scope)
				ctx.SwitchToScopeAtPoint(scope, NULL);

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(failed)
			{
				*failed = true;
				return ctx.typeGeneric;
			}

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
		{
			unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

			for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			{
				hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
				hash = NULLC::StringHashContinue(hash, ".");
			}

			hash = NULLC::StringHashContinue(hash, node->name.begin, node->name.end);

			TypeBase *type = LookupTypeByName(ctx, hash);

			if(type)
				return type;
		}

		// Might be a variable
		if(!onlyType)
			return NULL;

		Report(ctx, syntax, "ERROR: '%.*s' is not a known type name", FMT_ISTR(node->name));

		return ctx.GetErrorType();
	}

	if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		TypeBase *value = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !value)
			return NULL;

		if(isType<TypeGeneric>(value))
			return ctx.typeGeneric;

		if(isType<TypeError>(value))
			return ctx.GetErrorType();

		ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, value, node->member);

		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(result))
			return typeLiteral->value;

		// [n]

		if(!onlyType)
			return NULL;

		// isReference/isArray/isFunction/arraySize/hasMember(x)/class member/class typedef

		Stop(ctx, syntax, "ERROR: typeof expression result is not a type");

		return NULL;
	}

	if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		TypeBase *baseType = AnalyzeType(ctx, node->baseType, true, failed);

		if(isType<TypeError>(baseType))
			return ctx.GetErrorType();

		// TODO: overloads with a different number of generic arguments

		if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(baseType))
		{
			IntrusiveList<SynIdentifier> aliases = proto->definition->aliases;

			if(node->types.size() < aliases.size())
				Stop(ctx, syntax, "ERROR: there where only '%d' argument(s) to a generic type that expects '%d'", node->types.size(), aliases.size());

			if(node->types.size() > aliases.size())
				Stop(ctx, syntax, "ERROR: type has only '%d' generic argument(s) while '%d' specified", aliases.size(), node->types.size());

			bool isGeneric = false;
			IntrusiveList<TypeHandle> types;

			for(SynBase *el = node->types.head; el; el = el->next)
			{
				TypeBase *type = AnalyzeType(ctx, el, true, failed);

				if(type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: 'auto' type cannot be used as template argument");

				if(isType<TypeError>(type))
					return ctx.GetErrorType();

				isGeneric |= type->isGeneric;

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			if(isGeneric)
				return ctx.GetGenericClassType(syntax, proto, types);
			
			return CreateGenericTypeInstance(ctx, syntax, proto, types);
		}

		Stop(ctx, syntax, "ERROR: type '%.*s' can't have generic arguments", FMT_ISTR(baseType->name));
	}

	if(isType<SynError>(syntax))
		return ctx.GetErrorType();

	if(!onlyType)
		return NULL;

	Stop(ctx, syntax, "ERROR: unknown type");

	return NULL;
}